

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscReaderGeneric::GetDeferred
          (SscReaderGeneric *this,VariableBase *variable,void *data)

{
  size_t sVar1;
  undefined8 uVar2;
  string *psVar3;
  bool bVar4;
  __type _Var5;
  reference ppVar6;
  reference puVar7;
  char *pcVar8;
  uint8_t *puVar9;
  string *in_RDX;
  long in_RSI;
  long in_RDI;
  unsigned_long c;
  const_iterator __end7;
  const_iterator __begin7;
  Dims *__range7;
  bool empty;
  BlockInfo *b_1;
  const_iterator __end5_1;
  const_iterator __begin5_1;
  value_type *__range5_1;
  value_type *v_1;
  pair<const_int,_std::pair<unsigned_long,_unsigned_long>_> *i_1;
  iterator __end4;
  iterator __begin4;
  RankPosMap *__range4;
  DimsArray vMemCount;
  DimsArray vMemStart;
  DimsArray vShape;
  DimsArray vCount;
  DimsArray vStart;
  BlockInfo *b;
  const_iterator __end6;
  const_iterator __begin6;
  value_type *__range6;
  value_type *v;
  pair<const_int,_std::pair<unsigned_long,_unsigned_long>_> *i;
  iterator __end5;
  iterator __begin5;
  RankPosMap *__range5;
  string *dataString;
  CoreDims *in_stack_fffffffffffff7b8;
  CoreDims *in_stack_fffffffffffff7c0;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7cc;
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  int in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7dc;
  DimsArray *in_stack_fffffffffffff7e0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_fffffffffffff7e8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_fffffffffffff7f0;
  allocator local_769;
  string local_768 [39];
  allocator local_741;
  string local_740 [39];
  allocator local_719;
  string local_718 [39];
  allocator local_6f1;
  string local_6f0 [32];
  CoreDims local_6d0 [2];
  CoreDims local_6b0;
  CoreDims local_6a0;
  unsigned_long local_690;
  unsigned_long *local_688;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_680;
  Dims *local_678;
  byte local_669;
  reference local_668;
  void *in_stack_fffffffffffff9a0;
  __normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
  in_stack_fffffffffffff9a8;
  SscReaderGeneric *in_stack_fffffffffffff9b0;
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_638;
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_630;
  long local_628;
  CoreDims local_620 [17];
  CoreDims local_510 [17];
  CoreDims local_400 [17];
  CoreDims local_2f0 [17];
  CoreDims local_1e0 [18];
  allocator<char> local_b9;
  char *local_b8;
  char *local_b0;
  string local_a8 [32];
  reference local_88;
  BlockInfo *local_80;
  __normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
  local_78;
  reference local_70;
  reference local_68;
  reference local_60;
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_58;
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_50;
  long local_48;
  string *local_40;
  string *local_38;
  long local_30;
  
  if (*(int *)(in_RSI + 0x28) == 0xe) {
    if (((*(long *)(in_RDI + 0x88) == 0) || ((*(byte *)(in_RDI + 0xc9) & 1) == 0)) ||
       ((*(byte *)(in_RDI + 0xca) & 1) == 0)) {
      GetDeferredDeltaCommon
                (in_stack_fffffffffffff9b0,(VariableBase *)in_stack_fffffffffffff9a8._M_current,
                 in_stack_fffffffffffff9a0);
    }
    else {
      local_48 = in_RDI + 0xf8;
      local_40 = in_RDX;
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
           ::begin((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                    *)in_stack_fffffffffffff7b8);
      local_58._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
           ::end((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                  *)in_stack_fffffffffffff7b8);
      while (bVar4 = std::__detail::operator!=(&local_50,&local_58), bVar4) {
        local_60 = std::__detail::
                   _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                   ::operator*((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                                *)0x1e6136);
        local_70 = std::
                   vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                   ::operator[]((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                                 *)(in_RDI + 0x130),(long)local_60->first);
        local_68 = local_70;
        local_78._M_current =
             (BlockInfo *)
             std::
             vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
             ::begin((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                      *)in_stack_fffffffffffff7b8);
        local_80 = (BlockInfo *)
                   std::
                   vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                   ::end((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                          *)in_stack_fffffffffffff7b8);
        while (bVar4 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                                   *)in_stack_fffffffffffff7c0,
                                  (__normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                                   *)in_stack_fffffffffffff7b8), bVar4) {
          local_88 = __gnu_cxx::
                     __normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                     ::operator*(&local_78);
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff7e0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
          if (_Var5) {
            local_b0 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                         ((vector<char,_std::allocator<char>_> *)
                                          in_stack_fffffffffffff7b8);
            local_b8 = (char *)std::vector<char,_std::allocator<char>_>::end
                                         ((vector<char,_std::allocator<char>_> *)
                                          in_stack_fffffffffffff7b8);
            std::allocator<char>::allocator();
            std::__cxx11::string::
            string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,void>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff7e0,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8
                       ,(allocator<char> *)
                        CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
            std::__cxx11::string::operator=(local_40,local_a8);
            std::__cxx11::string::~string(local_a8);
            std::allocator<char>::~allocator(&local_b9);
          }
          __gnu_cxx::
          __normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
          ::operator++(&local_78);
        }
        std::__detail::
        _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
        ::operator++((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                      *)in_stack_fffffffffffff7c0);
      }
    }
  }
  else {
    local_38 = in_RDX;
    local_30 = in_RSI;
    helper::DimsArray::DimsArray
              (in_stack_fffffffffffff7e0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
    helper::DimsArray::DimsArray
              (in_stack_fffffffffffff7e0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
    helper::DimsArray::DimsArray
              (in_stack_fffffffffffff7e0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
    helper::DimsArray::DimsArray
              (in_stack_fffffffffffff7e0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
    helper::DimsArray::DimsArray
              (in_stack_fffffffffffff7e0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
    if (*(int *)(*(long *)(in_RDI + 0xc0) + 0x58) != 0) {
      helper::CoreDims::begin(local_1e0);
      helper::CoreDims::end(local_1e0);
      std::reverse<unsigned_long*>
                ((unsigned_long *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      helper::CoreDims::begin(local_2f0);
      helper::CoreDims::end(local_2f0);
      std::reverse<unsigned_long*>
                ((unsigned_long *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      helper::CoreDims::begin(local_400);
      helper::CoreDims::end(local_400);
      std::reverse<unsigned_long*>
                ((unsigned_long *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      helper::CoreDims::begin(local_510);
      helper::CoreDims::end(local_510);
      std::reverse<unsigned_long*>
                ((unsigned_long *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      helper::CoreDims::begin(local_620);
      helper::CoreDims::end(local_620);
      std::reverse<unsigned_long*>
                ((unsigned_long *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    }
    if (((*(long *)(in_RDI + 0x88) == 0) || ((*(byte *)(in_RDI + 0xc9) & 1) == 0)) ||
       ((*(byte *)(in_RDI + 0xca) & 1) == 0)) {
      GetDeferredDeltaCommon
                (in_stack_fffffffffffff9b0,(VariableBase *)in_stack_fffffffffffff9a8._M_current,
                 in_stack_fffffffffffff9a0);
    }
    else {
      local_628 = in_RDI + 0xf8;
      local_630._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
           ::begin((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                    *)in_stack_fffffffffffff7b8);
      local_638._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
           ::end((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                  *)in_stack_fffffffffffff7b8);
      while (bVar4 = std::__detail::operator!=(&local_630,&local_638), bVar4) {
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                 ::operator*((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                              *)0x1e6556);
        std::
        vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
        ::operator[]((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                      *)(in_RDI + 0x130),(long)ppVar6->first);
        std::
        vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
        ::begin((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                 *)in_stack_fffffffffffff7b8);
        std::
        vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
        ::end((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
               *)in_stack_fffffffffffff7b8);
        while (bVar4 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                                   *)in_stack_fffffffffffff7c0,
                                  (__normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                                   *)in_stack_fffffffffffff7b8), bVar4) {
          local_668 = __gnu_cxx::
                      __normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                      ::operator*((__normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                                   *)&stack0xfffffffffffff9a8);
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff7e0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
          if (_Var5) {
            local_669 = 0;
            local_678 = &local_668->count;
            local_680._M_current =
                 (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffff7b8);
            local_688 = (unsigned_long *)
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_fffffffffffff7b8);
            while (bVar4 = __gnu_cxx::operator!=
                                     ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)in_stack_fffffffffffff7c0,
                                      (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)in_stack_fffffffffffff7b8), psVar3 = local_38, bVar4) {
              puVar7 = __gnu_cxx::
                       __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ::operator*(&local_680);
              local_690 = *puVar7;
              if (local_690 == 0) {
                local_669 = 1;
              }
              __gnu_cxx::
              __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator++(&local_680);
            }
            if ((local_669 & 1) == 0) {
              if ((local_668->shapeId == GlobalArray) || (local_668->shapeId == LocalArray)) {
                pcVar8 = Buffer::data<char>((Buffer *)(in_RDI + 0x70),0);
                sVar1 = local_668->bufferStart;
                helper::CoreDims::CoreDims
                          (in_stack_fffffffffffff7c0,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffff7b8);
                helper::CoreDims::CoreDims
                          (in_stack_fffffffffffff7c0,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffff7b8);
                psVar3 = local_38;
                uVar2 = *(undefined8 *)(local_30 + 0x30);
                helper::CoreDims::CoreDims
                          (in_stack_fffffffffffff7c0,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffff7b8);
                helper::CoreDims::CoreDims
                          (in_stack_fffffffffffff7c0,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffff7b8);
                in_stack_fffffffffffff7b8 = local_1e0;
                in_stack_fffffffffffff7c0 = local_2f0;
                in_stack_fffffffffffff7e0 = (DimsArray *)(local_6d0 + 1);
                in_stack_fffffffffffff7d8 = (int)uVar2;
                adios2::helper::NdCopy
                          (pcVar8 + sVar1,&local_6a0,&local_6b0,true,true,(char *)psVar3,
                           in_stack_fffffffffffff7b8,in_stack_fffffffffffff7c0,true,true,
                           in_stack_fffffffffffff7d8,(CoreDims *)in_stack_fffffffffffff7e0,local_6d0
                           ,local_510,local_620,false,Host,false);
              }
              else if ((local_668->shapeId == GlobalValue) || (local_668->shapeId == LocalValue)) {
                puVar9 = Buffer::data((Buffer *)(in_RDI + 0x70),0);
                memcpy(psVar3,puVar9 + local_668->bufferStart,local_668->bufferCount);
              }
              else {
                std::allocator<char>::allocator();
                uVar10 = (undefined4)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
                std::__cxx11::string::string(local_6f0,"Engine",&local_6f1);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_718,"SscReaderGeneric",&local_719);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_740,"GetDeferredCommon",&local_741);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_768,"unknown ShapeID",&local_769);
                in_stack_fffffffffffff7c0 = (CoreDims *)CONCAT44(uVar10,*(int *)(in_RDI + 0xb0));
                in_stack_fffffffffffff7b8 =
                     (CoreDims *)((ulong)in_stack_fffffffffffff7b8 & 0xffffffff00000000);
                adios2::helper::Log(local_6f0,local_718,local_740,local_768,*(int *)(in_RDI + 0x28),
                                    *(int *)(in_RDI + 0x28),0,*(int *)(in_RDI + 0xb0),FATALERROR);
                std::__cxx11::string::~string(local_768);
                std::allocator<char>::~allocator((allocator<char> *)&local_769);
                std::__cxx11::string::~string(local_740);
                std::allocator<char>::~allocator((allocator<char> *)&local_741);
                std::__cxx11::string::~string(local_718);
                std::allocator<char>::~allocator((allocator<char> *)&local_719);
                std::__cxx11::string::~string(local_6f0);
                std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
          ::operator++((__normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                        *)&stack0xfffffffffffff9a8);
        }
        std::__detail::
        _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
        ::operator++((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                      *)in_stack_fffffffffffff7c0);
      }
    }
  }
  return;
}

Assistant:

void SscReaderGeneric::GetDeferred(VariableBase &variable, void *data)
{

    if (variable.m_Type == DataType::String)
    {
        auto *dataString = reinterpret_cast<std::string *>(data);
        if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
            m_ReaderSelectionsLocked == false)
        {
            GetDeferredDeltaCommon(variable, data);
        }
        else
        {
            for (const auto &i : m_AllReceivingWriterRanks)
            {
                const auto &v = m_GlobalWritePattern[i.first];
                for (const auto &b : v)
                {
                    if (b.name == variable.m_Name)
                    {
                        *dataString = std::string(b.value.begin(), b.value.end());
                    }
                }
            }
        }
        return;
    }

    helper::DimsArray vStart(variable.m_Start);
    helper::DimsArray vCount(variable.m_Count);
    helper::DimsArray vShape(variable.m_Shape);
    helper::DimsArray vMemStart(variable.m_MemoryStart);
    helper::DimsArray vMemCount(variable.m_MemoryCount);

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
        std::reverse(vMemStart.begin(), vMemStart.end());
        std::reverse(vMemCount.begin(), vMemCount.end());
    }

    if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
        m_ReaderSelectionsLocked == false)
    {
        GetDeferredDeltaCommon(variable, data);
    }
    else
    {

        for (const auto &i : m_AllReceivingWriterRanks)
        {
            const auto &v = m_GlobalWritePattern[i.first];
            for (const auto &b : v)
            {
                if (b.name == variable.m_Name)
                {
                    bool empty = false;
                    for (const auto c : b.count)
                    {
                        if (c == 0)
                        {
                            empty = true;
                        }
                    }
                    if (empty)
                    {
                        continue;
                    }

                    if (b.shapeId == ShapeID::GlobalArray || b.shapeId == ShapeID::LocalArray)
                    {
                        helper::NdCopy(m_Buffer.data<char>() + b.bufferStart,
                                       helper::CoreDims(b.start), helper::CoreDims(b.count), true,
                                       true, reinterpret_cast<char *>(data), vStart, vCount, true,
                                       true, static_cast<int>(variable.m_ElementSize),
                                       helper::CoreDims(b.start), helper::CoreDims(b.count),
                                       vMemStart, vMemCount);
                    }
                    else if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
                    {
                        std::memcpy(data, m_Buffer.data() + b.bufferStart, b.bufferCount);
                    }
                    else
                    {
                        helper::Log("Engine", "SscReaderGeneric", "GetDeferredCommon",
                                    "unknown ShapeID", m_ReaderRank, m_ReaderRank, 0, m_Verbosity,
                                    helper::LogMode::FATALERROR);
                    }
                }
            }
        }
    }
}